

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private_impl.h
# Opt level: O0

void __thiscall raspicam::_private::Private_Impl::PORT_USERDATA::waitForFrame(PORT_USERDATA *this)

{
  unique_lock<std::mutex> *in_RDI;
  unique_lock<std::mutex> lck;
  ThreadCondition *this_00;
  
  this_00 = (ThreadCondition *)&stack0xffffffffffffffe8;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)this_00,(mutex_type *)in_RDI)
  ;
  *(undefined1 *)&in_RDI[9]._M_device = 1;
  ThreadCondition::Wait(this_00,in_RDI);
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)this_00);
  return;
}

Assistant:

void waitForFrame() {
                    //_mutex.lock();
                    std::unique_lock<std::mutex> lck ( _mutex );

                    wantToGrab=true;
//                    _mutex.unlock();
//                    Thcond.Wait();
                       Thcond.Wait(lck); //this will unlock the mutex and wait atomically
                }